

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

Position __thiscall tli_window_manager::Text::current_position(Text *this)

{
  pointer pcVar1;
  uint uVar2;
  Position PVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)this->cursor_position_;
  pcVar1 = (this->buffer_)._M_dataplus._M_p;
  uVar2 = 0;
  for (lVar5 = (long)this->index_; lVar5 < lVar4; lVar5 = lVar5 + 1) {
    uVar2 = uVar2 + (pcVar1[lVar5] == '\n');
  }
  PVar3.second = 0;
  PVar3.first = uVar2;
  for (; (this->index_ < lVar4 && (pcVar1[lVar4] != '\n')); lVar4 = lVar4 + -1) {
    PVar3 = (Position)((long)PVar3 + 0x100000000);
  }
  return PVar3;
}

Assistant:

Position Text::current_position() const {
    int row = 0;
    for (int i = index_; i < cursor_position_; ++i) {
        if (buffer_[i] == '\n') {
            ++row;
        }
    }

    int col = 0;
    for (int i = cursor_position_; i > index_; --i) {
        if (buffer_[i] != '\n') {
            ++col;
        } else {
            break;
        }
    }
    return std::make_pair(row, col);
}